

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  float *pfVar18;
  void *pvVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  undefined1 *puVar27;
  Mat *pMVar28;
  long lVar29;
  void *pvVar30;
  long lVar31;
  void **ppvVar32;
  uint uVar33;
  size_type __n;
  int iVar34;
  void *pvVar35;
  uint uVar36;
  undefined4 uVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int size_7;
  int remain;
  int remain_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_1c9;
  undefined1 local_1c8 [16];
  ulong local_1b8;
  void *local_1b0;
  Mat *local_1a8;
  float *local_1a0;
  ulong local_198;
  ulong local_190;
  long local_188;
  uint local_17c;
  Mat local_178;
  long local_130;
  ulong local_128;
  void **local_120;
  void **local_118;
  ulong local_110;
  Mat *local_108;
  long local_100;
  long local_f8;
  ulong local_f0;
  void *local_e8;
  Mat *local_e0;
  void *local_d8;
  void *local_d0;
  undefined1 *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Option *local_b0;
  long local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  void *local_80;
  long local_78;
  void *local_70;
  long local_68;
  Mat *local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar26 = bottom_blob->c;
  iVar34 = -100;
  if ((iVar26 % this->group == 0) && (iVar43 = this->num_output, iVar43 % this->group == 0)) {
    iVar34 = bottom_blob->w;
    local_188 = (long)iVar34;
    uVar33 = bottom_blob->h;
    local_110 = (ulong)uVar33;
    iVar2 = this->kernel_w;
    iVar23 = this->dilation_w;
    sVar6 = bottom_blob->elemsize;
    iVar17 = this->stride_w;
    iVar21 = this->kernel_h;
    iVar25 = this->dilation_h;
    iVar3 = this->stride_h;
    iVar4 = this->output_pad_right;
    iVar5 = this->output_pad_bottom;
    local_178.cstep = 0;
    local_178.data = (Mat *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    auVar39._0_4_ = -(uint)(0 < this->pad_left);
    auVar39._4_4_ = -(uint)(0 < this->pad_right);
    auVar39._8_4_ = -(uint)(0 < this->pad_top);
    auVar39._12_4_ = -(uint)(0 < this->pad_bottom);
    iVar20 = movmskps(uVar33,auVar39);
    lVar15 = 0x10;
    if ((iVar20 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
      if (&local_178 != top_blob) {
        piVar7 = top_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        local_178.data = top_blob->data;
        local_178.refcount._0_4_ = SUB84(top_blob->refcount,0);
        local_178.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
        local_178.elemsize = top_blob->elemsize;
        local_178.elempack = top_blob->elempack;
        local_178.allocator = top_blob->allocator;
        uVar9 = top_blob->dims;
        uVar10 = top_blob->w;
        uVar11 = top_blob->h;
        uVar12 = top_blob->d;
        local_178.c = top_blob->c;
        local_178.cstep = top_blob->cstep;
        local_178.dims = uVar9;
        local_178.w = uVar10;
        local_178.h = uVar11;
        local_178.d = uVar12;
      }
      iVar43 = this->num_output;
      lVar15 = 8;
    }
    iVar23 = (iVar2 + -1) * iVar23 + (iVar34 + -1) * iVar17 + iVar4 + 1;
    iVar2 = iVar5 + 1 + (iVar21 + -1) * iVar25 + (uVar33 - 1) * iVar3;
    local_1a8 = bottom_blob;
    local_108 = top_blob;
    local_b0 = opt;
    Mat::create(&local_178,iVar23,iVar2,iVar43,sVar6,*(Allocator **)(&opt->lightmode + lVar15));
    iVar34 = -100;
    if (((Mat *)local_178.data != (Mat *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
      local_1c8._0_4_ = iVar23;
      uVar33 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar33;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1c9);
      piVar13 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < this->kernel_h) {
        iVar34 = this->dilation_h;
        iVar43 = this->dilation_w;
        iVar23 = this->kernel_w;
        iVar17 = 0;
        iVar21 = 0;
        iVar25 = 0;
        do {
          if (0 < this->kernel_w) {
            lVar15 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar17 + lVar15] = iVar21;
              iVar21 = iVar21 + this->dilation_w;
              lVar15 = lVar15 + 1;
            } while ((int)lVar15 < this->kernel_w);
            iVar17 = iVar17 + (int)lVar15;
          }
          iVar21 = iVar21 + (iVar34 * local_1c8._0_4_ - iVar43 * iVar23);
          iVar25 = iVar25 + 1;
        } while (iVar25 < this->kernel_h);
      }
      iVar34 = this->group;
      if (iVar34 == this->num_output && iVar26 == iVar34) {
        local_d0 = (void *)(long)this->group;
        if (0 < (long)local_d0) {
          local_d8 = local_1a8->data;
          pvVar35 = (this->weight_data).data;
          local_118 = (void **)(local_178.cstep * local_178.elemsize);
          local_190 = (ulong)(uint)(iVar2 * local_1c8._0_4_);
          local_128 = local_1a8->cstep * local_1a8->elemsize;
          local_98._0_4_ = this->bias_term;
          local_e8 = (this->bias_data).data;
          local_1a0 = (float *)(this->activation_params).data;
          uVar14 = local_178.d * local_178.h * local_178.w;
          if (local_178.dims == 3) {
            uVar14 = local_178.h * local_178.w;
          }
          local_120 = (void **)(ulong)uVar14;
          local_198 = (ulong)(uVar14 + 3 & 0xfffffffc);
          lVar15 = (long)local_120 + -1;
          auVar44._8_4_ = (int)lVar15;
          auVar44._0_8_ = lVar15;
          auVar44._12_4_ = (int)((ulong)lVar15 >> 0x20);
          local_130 = local_178.elemsize * (long)local_178.w;
          puVar27 = (undefined1 *)((long)((long)local_178.data + 8) + 4);
          pvVar30 = (void *)0x0;
          auVar44 = auVar44 ^ _DAT_00312030;
          local_1b8 = (ulong)(this->activation_type - 1);
          local_e0 = (Mat *)local_178.data;
          pMVar28 = (Mat *)local_178.data;
          auVar39 = _DAT_00312010;
          auVar45 = _DAT_00312020;
          auVar46 = _DAT_00312030;
          local_1c8 = auVar44;
          do {
            uVar37 = 0;
            if (local_98._0_4_ != 0) {
              uVar37 = *(undefined4 *)((long)local_e8 + (long)pvVar30 * 4);
            }
            if (0 < (int)local_120) {
              uVar16 = 0;
              do {
                auVar40._8_4_ = (int)uVar16;
                auVar40._0_8_ = uVar16;
                auVar40._12_4_ = (int)(uVar16 >> 0x20);
                auVar42 = (auVar40 | auVar45) ^ auVar46;
                iVar26 = auVar44._4_4_;
                if ((bool)(~(iVar26 < auVar42._4_4_ ||
                            auVar44._0_4_ < auVar42._0_4_ && auVar42._4_4_ == iVar26) & 1)) {
                  *(undefined4 *)(puVar27 + uVar16 * 4 + -0xc) = uVar37;
                }
                if (auVar42._12_4_ <= auVar44._12_4_ &&
                    (auVar42._8_4_ <= auVar44._8_4_ || auVar42._12_4_ != auVar44._12_4_)) {
                  *(undefined4 *)(puVar27 + uVar16 * 4 + -8) = uVar37;
                }
                auVar42 = (auVar40 | auVar39) ^ auVar46;
                iVar34 = auVar42._4_4_;
                if (iVar34 <= iVar26 && (iVar34 != iVar26 || auVar42._0_4_ <= auVar44._0_4_)) {
                  *(undefined4 *)(puVar27 + uVar16 * 4 + -4) = uVar37;
                  *(undefined4 *)(puVar27 + uVar16 * 4) = uVar37;
                }
                uVar16 = uVar16 + 4;
              } while (local_198 != uVar16);
            }
            if (0 < (int)local_110) {
              iVar26 = this->stride_h;
              iVar34 = this->stride_w;
              uVar16 = 0;
              do {
                if (0 < (int)local_188) {
                  lVar15 = 0;
                  do {
                    if (0 < (int)uVar33) {
                      lVar31 = lVar15 * iVar34 * 4 +
                               uVar16 * iVar26 * local_130 + (long)local_118 * (long)pvVar30;
                      uVar24 = 0;
                      do {
                        lVar22 = (long)piVar13[uVar24];
                        *(float *)((long)&local_e0->data + lVar22 * 4 + lVar31) =
                             *(float *)((long)pvVar35 + uVar24 * 4) *
                             *(float *)((long)local_d8 +
                                       lVar15 * 4 +
                                       uVar16 * local_188 * 4 + local_128 * (long)pvVar30) +
                             *(float *)((long)&local_e0->data + lVar22 * 4 + lVar31);
                        uVar24 = uVar24 + 1;
                      } while (uVar33 != uVar24);
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != local_188);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != local_110);
            }
            local_1b0 = pvVar30;
            local_1a8 = pMVar28;
            local_c8 = puVar27;
            if ((uint)local_1b8 < 4) {
              iVar26 = (int)local_190;
              switch((long)&switchD_002a3ef0::switchdataD_0031645c +
                     (long)(int)(&switchD_002a3ef0::switchdataD_0031645c)[local_1b8]) {
              case 0x2a3ef2:
                if (0 < iVar26) {
                  uVar16 = 0;
                  do {
                    fVar38 = *(float *)((long)&pMVar28->data + uVar16 * 4);
                    if (fVar38 <= 0.0) {
                      fVar38 = 0.0;
                    }
                    *(float *)((long)&pMVar28->data + uVar16 * 4) = fVar38;
                    uVar16 = uVar16 + 1;
                  } while (local_190 != uVar16);
                }
                break;
              case 0x2a3f1d:
                if (0 < iVar26) {
                  fVar38 = *local_1a0;
                  fVar1 = local_1a0[1];
                  uVar16 = 0;
                  do {
                    pfVar18 = (float *)((long)&pMVar28->data + uVar16 * 4);
                    if (*pfVar18 <= fVar38 && fVar38 != *pfVar18) {
                      *(float *)((long)&pMVar28->data + uVar16 * 4) = fVar38;
                    }
                    if (fVar1 < *(float *)((long)&pMVar28->data + uVar16 * 4)) {
                      *(float *)((long)&pMVar28->data + uVar16 * 4) = fVar1;
                    }
                    uVar16 = uVar16 + 1;
                  } while (local_190 != uVar16);
                }
                break;
              case 0x2a3f5c:
                if (0 < iVar26) {
                  fVar38 = *local_1a0;
                  uVar16 = 0;
                  do {
                    fVar1 = *(float *)((long)&pMVar28->data + uVar16 * 4);
                    uVar14 = -(uint)(0.0 < fVar1);
                    *(float *)((long)&pMVar28->data + uVar16 * 4) =
                         (float)(~uVar14 & (uint)fVar38 | uVar14 & 0x3f800000) * fVar1;
                    uVar16 = uVar16 + 1;
                  } while (local_190 != uVar16);
                }
                break;
              case 0x2a3fa6:
                if (0 < iVar26) {
                  uVar16 = 0;
                  do {
                    fVar38 = expf((float)(*(uint *)((long)&local_1a8->data + uVar16 * 4) ^
                                         auVar46._0_4_));
                    auVar46 = _DAT_00312030;
                    auVar45 = _DAT_00312020;
                    auVar39 = _DAT_00312010;
                    *(float *)((long)&local_1a8->data + uVar16 * 4) = 1.0 / (fVar38 + 1.0);
                    uVar16 = uVar16 + 1;
                    auVar44 = local_1c8;
                  } while (local_190 != uVar16);
                }
              }
            }
            pvVar30 = (void *)((long)local_1b0 + 1);
            puVar27 = local_c8 + (long)local_118;
            pvVar35 = (void *)((long)pvVar35 + __n * 4);
            pMVar28 = (Mat *)((long)local_118 + (long)&local_1a8->data);
          } while (pvVar30 != local_d0);
        }
      }
      else {
        uVar14 = iVar26 / iVar34;
        local_17c = this->num_output / iVar34;
        local_78 = (long)this->group;
        if (0 < local_78) {
          local_bc = local_178.dims;
          local_80 = (this->weight_data).data;
          local_b4 = this->bias_term;
          local_190 = (ulong)(uint)(iVar2 * local_1c8._0_4_);
          local_a8 = (long)(int)local_17c;
          local_58 = (void *)(ulong)local_17c;
          local_b8 = uVar14 * uVar33 * local_17c;
          local_50 = (long)(int)(uVar14 * uVar33) << 2;
          local_f0 = 0;
          local_128 = (ulong)(this->activation_type - 1);
          local_f8 = 0;
          local_100 = 0;
          auVar39 = _DAT_00312010;
          auVar45 = _DAT_00312020;
          auVar46 = _DAT_00312030;
          do {
            if (0 < (int)local_17c) {
              local_1b0 = (void *)((long)local_80 + (long)(int)local_f0 * 4);
              local_e0 = (Mat *)(local_100 * local_a8);
              local_130 = local_178.cstep * local_178.elemsize;
              iVar26 = (int)local_100;
              local_a0 = (float *)(this->activation_params).data;
              local_70 = (this->bias_data).data;
              uVar36 = local_178.d * local_178.h * local_178.w;
              if (local_bc == 3) {
                uVar36 = local_178.h * local_178.w;
              }
              local_e8 = (void *)(ulong)uVar36;
              local_1a0 = (float *)(ulong)(uVar36 + 3 & 0xfffffffc);
              lVar15 = (long)local_e8 + -1;
              auVar42._8_4_ = (int)lVar15;
              auVar42._0_8_ = lVar15;
              auVar42._12_4_ = (int)((ulong)lVar15 >> 0x20);
              local_68 = local_178.elemsize * (long)local_178.w;
              local_198 = (long)((long)local_178.data + 8) + local_130 * local_f8 + 4;
              local_60 = (Mat *)local_178.data;
              ppvVar32 = (void **)((long)(void **)local_178.data + local_130 * local_f8);
              auVar42 = auVar42 ^ auVar46;
              pvVar35 = (void *)0x0;
              local_98 = auVar42;
              do {
                lVar15 = (long)&local_e0->data + (long)pvVar35;
                if (local_b4 == 0) {
                  uVar37 = 0;
                }
                else {
                  uVar37 = *(undefined4 *)((long)local_70 + lVar15 * 4);
                }
                if (0 < (int)local_e8) {
                  pfVar18 = (float *)0x0;
                  do {
                    auVar41._8_4_ = (int)pfVar18;
                    auVar41._0_8_ = pfVar18;
                    auVar41._12_4_ = (int)((ulong)pfVar18 >> 0x20);
                    auVar44 = (auVar41 | auVar45) ^ auVar46;
                    iVar34 = auVar42._4_4_;
                    if ((bool)(~(iVar34 < auVar44._4_4_ ||
                                auVar42._0_4_ < auVar44._0_4_ && auVar44._4_4_ == iVar34) & 1)) {
                      *(undefined4 *)(local_198 + (long)pfVar18 * 4 + -0xc) = uVar37;
                    }
                    if (auVar44._12_4_ <= auVar42._12_4_ &&
                        (auVar44._8_4_ <= auVar42._8_4_ || auVar44._12_4_ != auVar42._12_4_)) {
                      *(undefined4 *)(local_198 + (long)pfVar18 * 4 + -8) = uVar37;
                    }
                    auVar41 = (auVar41 | auVar39) ^ auVar46;
                    iVar43 = auVar41._4_4_;
                    if (iVar43 <= iVar34 && (iVar43 != iVar34 || auVar41._0_4_ <= auVar42._0_4_)) {
                      *(undefined4 *)(local_198 + (long)pfVar18 * 4 + -4) = uVar37;
                      *(undefined4 *)(local_198 + (long)pfVar18 * 4) = uVar37;
                    }
                    pfVar18 = pfVar18 + 1;
                  } while (local_1a0 != pfVar18);
                }
                if (0 < (int)local_110) {
                  local_118 = (void **)((long)&local_60->data + lVar15 * local_130);
                  local_d0 = (void *)(this->stride_h * local_68);
                  local_c8 = (undefined1 *)(long)this->stride_w;
                  local_1b8 = 0;
                  do {
                    if (0 < (int)local_188) {
                      lVar15 = (long)local_1a8->w * local_1b8;
                      local_1c8._0_8_ = lVar15;
                      lVar31 = 0;
                      do {
                        if (0 < (int)uVar14) {
                          sVar6 = local_1a8->elemsize;
                          sVar8 = local_1a8->cstep;
                          pvVar30 = local_1a8->data;
                          lVar22 = lVar31 * (long)local_c8 * 4 + local_1b8 * (long)local_d0;
                          uVar16 = 0;
                          pvVar19 = local_1b0;
                          do {
                            if (0 < (int)uVar33) {
                              fVar38 = *(float *)((long)pvVar30 +
                                                 (uVar16 + uVar14 * iVar26) * sVar8 * sVar6 +
                                                 lVar31 * 4 + sVar6 * lVar15);
                              uVar24 = 0;
                              do {
                                lVar29 = (long)piVar13[uVar24];
                                *(float *)((long)local_118 + lVar29 * 4 + lVar22) =
                                     *(float *)((long)pvVar19 + uVar24 * 4) * fVar38 +
                                     *(float *)((long)local_118 + lVar29 * 4 + lVar22);
                                uVar24 = uVar24 + 1;
                              } while (uVar33 != uVar24);
                            }
                            uVar16 = uVar16 + 1;
                            pvVar19 = (void *)((long)pvVar19 + __n * 4);
                          } while (uVar16 != uVar14);
                        }
                        lVar31 = lVar31 + 1;
                      } while (lVar31 != local_188);
                    }
                    local_1b8 = local_1b8 + 1;
                  } while (local_1b8 != local_110);
                }
                local_120 = ppvVar32;
                local_d8 = pvVar35;
                if ((uint)local_128 < 4) {
                  iVar34 = (int)local_190;
                  switch((long)&switchD_002a44c4::switchdataD_0031644c +
                         (long)(int)(&switchD_002a44c4::switchdataD_0031644c)[local_128]) {
                  case 0x2a44c6:
                    if (0 < iVar34) {
                      uVar16 = 0;
                      do {
                        fVar38 = *(float *)((long)ppvVar32 + uVar16 * 4);
                        if (fVar38 <= 0.0) {
                          fVar38 = 0.0;
                        }
                        *(float *)((long)ppvVar32 + uVar16 * 4) = fVar38;
                        uVar16 = uVar16 + 1;
                      } while (local_190 != uVar16);
                    }
                    break;
                  case 0x2a44f1:
                    if (0 < iVar34) {
                      fVar38 = *local_a0;
                      fVar1 = local_a0[1];
                      uVar16 = 0;
                      do {
                        pfVar18 = (float *)((long)ppvVar32 + uVar16 * 4);
                        if (*pfVar18 <= fVar38 && fVar38 != *pfVar18) {
                          *(float *)((long)ppvVar32 + uVar16 * 4) = fVar38;
                        }
                        if (fVar1 < *(float *)((long)ppvVar32 + uVar16 * 4)) {
                          *(float *)((long)ppvVar32 + uVar16 * 4) = fVar1;
                        }
                        uVar16 = uVar16 + 1;
                      } while (local_190 != uVar16);
                    }
                    break;
                  case 0x2a4533:
                    if (0 < iVar34) {
                      uVar16 = 0;
                      do {
                        local_1c8._0_8_ = uVar16;
                        fVar38 = expf((float)(*(uint *)((long)local_120 + uVar16 * 4) ^
                                             auVar46._0_4_));
                        auVar46 = _DAT_00312030;
                        auVar45 = _DAT_00312020;
                        auVar39 = _DAT_00312010;
                        *(float *)((long)local_120 + local_1c8._0_8_ * 4) = 1.0 / (fVar38 + 1.0);
                        uVar16 = local_1c8._0_8_ + 1;
                        auVar42 = local_98;
                      } while (local_190 != uVar16);
                    }
                    break;
                  case 0x2a45aa:
                    if (0 < iVar34) {
                      fVar38 = *local_a0;
                      uVar16 = 0;
                      do {
                        fVar1 = *(float *)((long)ppvVar32 + uVar16 * 4);
                        uVar36 = -(uint)(0.0 < fVar1);
                        *(float *)((long)ppvVar32 + uVar16 * 4) =
                             (float)(~uVar36 & (uint)fVar38 | uVar36 & 0x3f800000) * fVar1;
                        uVar16 = uVar16 + 1;
                      } while (local_190 != uVar16);
                    }
                  }
                }
                pvVar35 = (void *)((long)local_d8 + 1);
                local_198 = local_198 + local_130;
                local_1b0 = (void *)((long)local_1b0 + local_50);
                ppvVar32 = (void **)((long)local_120 + local_130);
              } while (pvVar35 != local_58);
            }
            local_100 = local_100 + 1;
            local_f8 = local_f8 + local_a8;
            local_f0 = (ulong)(uint)((int)local_f0 + local_b8);
          } while (local_100 != local_78);
        }
      }
      pMVar28 = local_108;
      cut_padding(this,&local_178,local_108,local_b0);
      if (pMVar28->data == (void *)0x0) {
        iVar34 = -100;
      }
      else {
        iVar34 = -100;
        if ((long)pMVar28->c * pMVar28->cstep != 0) {
          iVar34 = 0;
        }
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if ((Mat *)local_178.data != (Mat *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar34;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i * w + j];
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}